

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O0

int nn_sock_add_ep(nn_sock *self,nn_transport *transport,int bind,char *addr)

{
  int iVar1;
  nn_ep *self_00;
  nn_list_item *it;
  nn_transport *in_RCX;
  undefined4 in_EDX;
  long in_RDI;
  int eid;
  nn_ep *ep;
  int rc;
  undefined8 in_stack_ffffffffffffffb0;
  nn_sock *in_stack_ffffffffffffffb8;
  nn_list_item *item;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  int local_4;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  nn_ctx_enter((nn_ctx *)0x125d85);
  self_00 = (nn_ep *)nn_alloc_(0x125d8f);
  iVar1 = nn_ep_init(self_00,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8,iVar1,in_RCX,0,
                     (char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0));
  if (iVar1 < 0) {
    nn_free((void *)0x125de9);
    nn_ctx_leave((nn_ctx *)CONCAT44(iVar1,in_stack_ffffffffffffffd0));
    local_4 = iVar1;
  }
  else {
    nn_ep_start((nn_ep *)0x125e0e);
    local_4 = *(int *)(in_RDI + 0x138);
    *(int *)(in_RDI + 0x138) = *(int *)(in_RDI + 0x138) + 1;
    it = (nn_list_item *)(in_RDI + 0x118);
    item = &self_00->item;
    nn_list_end((nn_list *)(in_RDI + 0x118));
    nn_list_insert((nn_list *)CONCAT44(local_4,in_stack_ffffffffffffffc0),item,it);
    nn_ctx_leave((nn_ctx *)CONCAT44(iVar1,in_stack_ffffffffffffffd0));
  }
  return local_4;
}

Assistant:

int nn_sock_add_ep (struct nn_sock *self, const struct nn_transport *transport,
    int bind, const char *addr)
{
    int rc;
    struct nn_ep *ep;
    int eid;

    nn_ctx_enter (&self->ctx);

    /*  Instantiate the endpoint. */
    ep = nn_alloc (sizeof (struct nn_ep), "endpoint");
    rc = nn_ep_init (ep, NN_SOCK_SRC_EP, self, self->eid, transport,
        bind, addr);
    if (nn_slow (rc < 0)) {
        nn_free (ep);
        nn_ctx_leave (&self->ctx);
        return rc;
    }
    nn_ep_start (ep);

    /*  Increase the endpoint ID for the next endpoint. */
    eid = self->eid;
    ++self->eid;

    /*  Add it to the list of active endpoints. */
    nn_list_insert (&self->eps, &ep->item, nn_list_end (&self->eps));

    nn_ctx_leave (&self->ctx);

    return eid;
}